

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall KktCheck::printSol(KktCheck *this)

{
  pointer pdVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  char buff [10];
  char local_32 [10];
  
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar2,"Col value: ");
  uVar3 = 0;
  while( true ) {
    pdVar1 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar3) break;
    sprintf(local_32,"%2.2f ",pdVar1[uVar3]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,local_32);
    uVar3 = uVar3 + 1;
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar2,"Col dual:  ");
  uVar3 = 0;
  while( true ) {
    pdVar1 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar3) break;
    sprintf(local_32,"%2.2f ",pdVar1[uVar3]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,local_32);
    uVar3 = uVar3 + 1;
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar2,"Row dual:  ");
  uVar3 = 0;
  while( true ) {
    pdVar1 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <= uVar3) break;
    sprintf(local_32,"%2.2f ",pdVar1[uVar3]);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,local_32);
    uVar3 = uVar3 + 1;
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void KktCheck::printSol() {
	char buff [10];
	cout<<endl<<"Col value: ";
	for (size_t i=0;i<colValue.size();i++) {
		sprintf(buff, "%2.2f ", colValue[i]); 
		cout<<setw(5)<<buff; 
		}  
	cout<<endl<<"Col dual:  ";
	for (size_t i=0;i<colDual.size();i++) {
		sprintf(buff, "%2.2f ", colDual[i]);
		cout<<setw(5)<<buff; 
		}  
/*	cout<<endl<<"Row value: ";
	for (i=0;i<numRow;i++) {
	  	sprintf(buff, "%2.2f ", rowValue[i]);  
	  	cout<<setw(5)<<buff;
	  	}*/
	cout<<endl<<"Row dual:  ";
	for (size_t i=0;i<rowDual.size();i++) {
		sprintf(buff, "%2.2f ", rowDual[i]);  
		cout<<setw(5)<<buff; 
		}  
	cout<<endl<<endl;
}